

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::SetSpecial(CNetAddr *this,string *addr)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  size_type sVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = addr->_M_string_length == 0;
  if ((!bVar6) && (pcVar3 = (addr->_M_dataplus)._M_p, *pcVar3 != '\0')) {
    sVar5 = 1;
    do {
      bVar6 = addr->_M_string_length == sVar5;
      if (bVar6) break;
      pcVar1 = pcVar3 + sVar5;
      sVar5 = sVar5 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar6) {
    bVar4 = SetTor(this,addr);
    bVar6 = true;
    if (!bVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        bVar6 = SetI2P(this,addr);
        return bVar6;
      }
      goto LAB_006cedd3;
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
LAB_006cedd3:
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetSpecial(const std::string& addr)
{
    if (!ContainsNoNUL(addr)) {
        return false;
    }

    if (SetTor(addr)) {
        return true;
    }

    if (SetI2P(addr)) {
        return true;
    }

    return false;
}